

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O0

void __thiscall cmCTestSubmitHandler::ResponseParser::EndElement(ResponseParser *this,string *name)

{
  bool bVar1;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_58;
  undefined1 local_38 [8];
  string status;
  string *name_local;
  ResponseParser *this_local;
  
  status.field_2._8_8_ = name;
  bVar1 = std::operator==(name,"status");
  if (bVar1) {
    GetCurrentValue_abi_cxx11_(&local_58,this);
    cmsys::SystemTools::UpperCase((string *)local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"OK");
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"SUCCESS"), bVar1)) {
      this->Status = STATUS_OK;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"WARNING");
      if (bVar1) {
        this->Status = STATUS_WARNING;
      }
      else {
        this->Status = STATUS_ERROR;
      }
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            status.field_2._8_8_,"filename");
    if (bVar1) {
      GetCurrentValue_abi_cxx11_(&local_88,this);
      std::__cxx11::string::operator=((string *)&this->Filename,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              status.field_2._8_8_,"md5");
      if (bVar1) {
        GetCurrentValue_abi_cxx11_(&local_a8,this);
        std::__cxx11::string::operator=((string *)&this->MD5,(string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )status.field_2._8_8_,"message");
        if (bVar1) {
          GetCurrentValue_abi_cxx11_(&local_c8,this);
          std::__cxx11::string::operator=((string *)&this->Message,(string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)status.field_2._8_8_,"buildId");
          if (bVar1) {
            GetCurrentValue_abi_cxx11_(&local_e8,this);
            std::__cxx11::string::operator=((string *)&this->BuildID,(string *)&local_e8);
            std::__cxx11::string::~string((string *)&local_e8);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void EndElement(const std::string& name) override
  {
    if (name == "status") {
      std::string status = cmSystemTools::UpperCase(this->GetCurrentValue());
      if (status == "OK" || status == "SUCCESS") {
        this->Status = STATUS_OK;
      } else if (status == "WARNING") {
        this->Status = STATUS_WARNING;
      } else {
        this->Status = STATUS_ERROR;
      }
    } else if (name == "filename") {
      this->Filename = this->GetCurrentValue();
    } else if (name == "md5") {
      this->MD5 = this->GetCurrentValue();
    } else if (name == "message") {
      this->Message = this->GetCurrentValue();
    } else if (name == "buildId") {
      this->BuildID = this->GetCurrentValue();
    }
  }